

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O0

int YUY2ToNV12(uint8_t *src_yuy2,int src_stride_yuy2,uint8_t *dst_y,int dst_stride_y,uint8_t *dst_uv
              ,int dst_stride_uv,int width,int height)

{
  int iVar1;
  int iVar2;
  void *__ptr;
  void *__src;
  int in_ECX;
  void *in_RDX;
  int in_ESI;
  long in_RDI;
  long in_R8;
  int in_R9D;
  uint8_t *rows;
  uint8_t *rows_mem;
  uint in_stack_00000010;
  int awidth;
  _func_void_uint8_t_ptr_uint8_t_ptr_ptrdiff_t_int_int *InterpolateRow;
  _func_void_uint8_t_ptr_uint8_t_ptr_uint8_t_ptr_int *SplitUVRow;
  int halfwidth;
  int y;
  undefined8 in_stack_ffffffffffffffa0;
  int test_flag;
  code *local_50;
  code *local_48;
  int local_38;
  long local_30;
  void *local_20;
  int local_14;
  long local_10;
  int local_4;
  
  iVar1 = (int)((uint)rows_mem + 1) >> 1;
  local_48 = SplitUVRow_C;
  local_50 = InterpolateRow_C;
  if ((((in_RDI == 0) || (in_RDX == (void *)0x0)) || (in_R8 == 0)) ||
     (((int)(uint)rows_mem < 1 || (in_stack_00000010 == 0)))) {
    local_4 = -1;
  }
  else {
    local_14 = in_ESI;
    local_10 = in_RDI;
    if ((int)in_stack_00000010 < 0) {
      in_stack_00000010 = -in_stack_00000010;
      local_10 = in_RDI + (int)((in_stack_00000010 - 1) * in_ESI);
      local_14 = -in_ESI;
    }
    test_flag = (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
    iVar2 = libyuv::TestCpuFlag(test_flag);
    if ((iVar2 != 0) && (local_48 = SplitUVRow_Any_SSE2, ((uint)rows_mem & 0xf) == 0)) {
      local_48 = SplitUVRow_SSE2;
    }
    iVar2 = libyuv::TestCpuFlag(test_flag);
    if ((iVar2 != 0) && (local_48 = SplitUVRow_Any_AVX2, ((uint)rows_mem & 0x1f) == 0)) {
      local_48 = SplitUVRow_AVX2;
    }
    iVar2 = libyuv::TestCpuFlag(test_flag);
    if ((iVar2 != 0) && (local_50 = InterpolateRow_Any_SSSE3, ((uint)rows_mem & 0xf) == 0)) {
      local_50 = InterpolateRow_SSSE3;
    }
    iVar2 = libyuv::TestCpuFlag(test_flag);
    if ((iVar2 != 0) && (local_50 = InterpolateRow_Any_AVX2, ((uint)rows_mem & 0x1f) == 0)) {
      local_50 = InterpolateRow_AVX2;
    }
    iVar2 = iVar1 * 2;
    __ptr = malloc((long)(iVar1 * 6 + 0x3f));
    __src = (void *)((long)__ptr + 0x3fU & 0xffffffffffffffc0);
    local_30 = in_R8;
    local_20 = in_RDX;
    for (local_38 = 0; local_38 < (int)(in_stack_00000010 - 1); local_38 = local_38 + 2) {
      (*local_48)(local_10,__src,(long)__src + (long)iVar2,iVar2);
      memcpy(local_20,__src,(long)(int)(uint)rows_mem);
      (*local_48)(local_10 + local_14,__src,(long)__src + (long)(iVar1 << 2),iVar2);
      memcpy((void *)((long)local_20 + (long)in_ECX),__src,(long)(int)(uint)rows_mem);
      (*local_50)(local_30,(long)__src + (long)iVar2,(long)iVar2,iVar2,0x80);
      local_10 = local_10 + (local_14 << 1);
      local_20 = (void *)((long)local_20 + (long)(in_ECX << 1));
      local_30 = local_30 + in_R9D;
    }
    if ((in_stack_00000010 & 1) != 0) {
      (*local_48)(local_10,__src,local_30,iVar2);
      memcpy(local_20,__src,(long)(int)(uint)rows_mem);
    }
    free(__ptr);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

LIBYUV_API
int YUY2ToNV12(const uint8_t* src_yuy2,
               int src_stride_yuy2,
               uint8_t* dst_y,
               int dst_stride_y,
               uint8_t* dst_uv,
               int dst_stride_uv,
               int width,
               int height) {
  int y;
  int halfwidth = (width + 1) >> 1;
  void (*SplitUVRow)(const uint8_t* src_uv, uint8_t* dst_u, uint8_t* dst_v,
                     int width) = SplitUVRow_C;
  void (*InterpolateRow)(uint8_t * dst_ptr, const uint8_t* src_ptr,
                         ptrdiff_t src_stride, int dst_width,
                         int source_y_fraction) = InterpolateRow_C;
  if (!src_yuy2 || !dst_y || !dst_uv || width <= 0 || height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    src_yuy2 = src_yuy2 + (height - 1) * src_stride_yuy2;
    src_stride_yuy2 = -src_stride_yuy2;
  }
#if defined(HAS_SPLITUVROW_SSE2)
  if (TestCpuFlag(kCpuHasSSE2)) {
    SplitUVRow = SplitUVRow_Any_SSE2;
    if (IS_ALIGNED(width, 16)) {
      SplitUVRow = SplitUVRow_SSE2;
    }
  }
#endif
#if defined(HAS_SPLITUVROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    SplitUVRow = SplitUVRow_Any_AVX2;
    if (IS_ALIGNED(width, 32)) {
      SplitUVRow = SplitUVRow_AVX2;
    }
  }
#endif
#if defined(HAS_SPLITUVROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    SplitUVRow = SplitUVRow_Any_NEON;
    if (IS_ALIGNED(width, 16)) {
      SplitUVRow = SplitUVRow_NEON;
    }
  }
#endif
#if defined(HAS_SPLITUVROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    SplitUVRow = SplitUVRow_Any_MMI;
    if (IS_ALIGNED(width, 8)) {
      SplitUVRow = SplitUVRow_MMI;
    }
  }
#endif
#if defined(HAS_SPLITUVROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    SplitUVRow = SplitUVRow_Any_MSA;
    if (IS_ALIGNED(width, 32)) {
      SplitUVRow = SplitUVRow_MSA;
    }
  }
#endif
#if defined(HAS_INTERPOLATEROW_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    InterpolateRow = InterpolateRow_Any_SSSE3;
    if (IS_ALIGNED(width, 16)) {
      InterpolateRow = InterpolateRow_SSSE3;
    }
  }
#endif
#if defined(HAS_INTERPOLATEROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    InterpolateRow = InterpolateRow_Any_AVX2;
    if (IS_ALIGNED(width, 32)) {
      InterpolateRow = InterpolateRow_AVX2;
    }
  }
#endif
#if defined(HAS_INTERPOLATEROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    InterpolateRow = InterpolateRow_Any_NEON;
    if (IS_ALIGNED(width, 16)) {
      InterpolateRow = InterpolateRow_NEON;
    }
  }
#endif
#if defined(HAS_INTERPOLATEROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    InterpolateRow = InterpolateRow_Any_MMI;
    if (IS_ALIGNED(width, 8)) {
      InterpolateRow = InterpolateRow_MMI;
    }
  }
#endif
#if defined(HAS_INTERPOLATEROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    InterpolateRow = InterpolateRow_Any_MSA;
    if (IS_ALIGNED(width, 32)) {
      InterpolateRow = InterpolateRow_MSA;
    }
  }
#endif

  {
    int awidth = halfwidth * 2;
    // row of y and 2 rows of uv
    align_buffer_64(rows, awidth * 3);

    for (y = 0; y < height - 1; y += 2) {
      // Split Y from UV.
      SplitUVRow(src_yuy2, rows, rows + awidth, awidth);
      memcpy(dst_y, rows, width);
      SplitUVRow(src_yuy2 + src_stride_yuy2, rows, rows + awidth * 2, awidth);
      memcpy(dst_y + dst_stride_y, rows, width);
      InterpolateRow(dst_uv, rows + awidth, awidth, awidth, 128);
      src_yuy2 += src_stride_yuy2 * 2;
      dst_y += dst_stride_y * 2;
      dst_uv += dst_stride_uv;
    }
    if (height & 1) {
      // Split Y from UV.
      SplitUVRow(src_yuy2, rows, dst_uv, awidth);
      memcpy(dst_y, rows, width);
    }
    free_aligned_buffer_64(rows);
  }
  return 0;
}